

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

obj * touchfood(obj *otmp)

{
  boolean bVar1;
  int iVar2;
  unsigned_short *puVar3;
  obj *unaff_RBX;
  
  if (1 < otmp->quan) {
    if (otmp->where == '\x03') {
      otmp = splitobj(otmp,1);
    }
    else {
      splitobj(otmp,(ulong)(otmp->quan - 1));
    }
  }
  if (otmp->oeaten != 0) goto LAB_0018d8a8;
  if (otmp->where == '\x03') {
LAB_0018d84c:
    if ((otmp->field_0x4a & 4) != 0) goto LAB_0018d852;
  }
  else {
    bVar1 = costly_spot(otmp->ox,otmp->oy);
    if ((bVar1 == '\0') || ((otmp->field_0x4a & 8) != 0)) goto LAB_0018d84c;
LAB_0018d852:
    verbalize("You bit it, you bought it!");
    bill_dummy_object(otmp);
  }
  if ((long)otmp->otyp == 0x10e) {
    puVar3 = &mons[otmp->corpsenm].cnutrit;
  }
  else {
    puVar3 = &objects[otmp->otyp].oc_nutrition;
  }
  otmp->oeaten = (uint)*puVar3;
LAB_0018d8a8:
  if (otmp->where == '\x03') {
    freeinv(otmp);
    iVar2 = inv_cnt();
    if (iVar2 < 0x34) {
      otmp->oxlth = otmp->oxlth + 1;
      otmp = addinv(unaff_RBX);
      otmp->oxlth = otmp->oxlth + -1;
    }
    else {
      sellobj_state(2);
      dropy(otmp);
      sellobj_state(0);
    }
  }
  return otmp;
}

Assistant:

static struct obj *touchfood(struct obj *otmp)
{
	if (otmp->quan > 1L) {
	    if (!carried(otmp))
		splitobj(otmp, otmp->quan - 1L);
	    else
		otmp = splitobj(otmp, 1L);
	}

	if (!otmp->oeaten) {
	    if (((!carried(otmp) && costly_spot(otmp->ox, otmp->oy) &&
		 !otmp->no_charge)
		 || otmp->unpaid)) {
		/* create a dummy duplicate to put on bill */
		verbalize("You bit it, you bought it!");
		bill_dummy_object(otmp);
	    }
	    otmp->oeaten = (otmp->otyp == CORPSE ?
				mons[otmp->corpsenm].cnutrit :
				objects[otmp->otyp].oc_nutrition);
	}

	if (carried(otmp)) {
	    freeinv(otmp);
	    if (inv_cnt() >= 52) {
		sellobj_state(SELL_DONTSELL);
		dropy(otmp);
		sellobj_state(SELL_NORMAL);
	    } else {
		otmp->oxlth++;		/* hack to prevent merge */
		otmp = addinv(otmp);
		otmp->oxlth--;
	    }
	}
	return otmp;
}